

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

Expression * __thiscall
wasm::OptimizeInstructions::combineOr(OptimizeInstructions *this,Binary *curr)

{
  Expression *pEVar1;
  Binary *curr_00;
  char *pcVar2;
  Expression *pEVar3;
  Const *pCVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  BinaryOp BVar8;
  Binary *pBVar9;
  EffectAnalyzer local_3b0;
  EffectAnalyzer local_250;
  undefined1 *local_f0;
  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
  local_e0;
  anon_union_16_6_1532cd5a_for_Literal_0 local_b0;
  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
  local_a0;
  Literal local_70;
  uintptr_t local_58;
  OptimizeInstructions *local_50;
  HeapType local_48;
  Const *cy;
  undefined1 local_38 [8];
  Const *cx;
  
  local_50 = this;
  if (curr->op != OrInt32) {
    __assert_fail("curr->op == OrInt32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xdef,"Expression *wasm::OptimizeInstructions::combineOr(Binary *)");
  }
  pBVar9 = (Binary *)0x0;
  if ((((Binary *)curr->left)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
      _id == BinaryId) {
    pBVar9 = (Binary *)curr->left;
  }
  if ((pBVar9 != (Binary *)0x0) && (pEVar1 = curr->right, pEVar1->_id == BinaryId)) {
    if ((pBVar9->op == *(BinaryOp *)(pEVar1 + 1)) ||
       ((bVar5 = ExpressionAnalyzer::equal(pBVar9->left,(Expression *)pEVar1[1].type.id), !bVar5 ||
        (bVar5 = ExpressionAnalyzer::equal(pBVar9->right,*(Expression **)(pEVar1 + 2)), !bVar5)))) {
      bVar5 = false;
LAB_009ea7f1:
      bVar6 = false;
      bVar7 = 0;
    }
    else {
      EffectAnalyzer::EffectAnalyzer
                (&local_3b0,
                 &((local_50->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner)->options,
                 (local_50->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule,pBVar9->left);
      bVar5 = true;
      if ((local_3b0.trap != false) ||
         (bVar6 = EffectAnalyzer::hasNonTrapSideEffects(&local_3b0), bVar6)) goto LAB_009ea7f1;
      EffectAnalyzer::EffectAnalyzer
                (&local_250,
                 &((local_50->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner)->options,
                 (local_50->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule,pBVar9->right);
      bVar6 = true;
      bVar5 = true;
      if (local_250.trap == false) {
        bVar5 = EffectAnalyzer::hasNonTrapSideEffects(&local_250);
      }
      bVar7 = bVar5 ^ 1;
      bVar5 = true;
    }
    if (bVar6) {
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_250.delegateTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_250.breakTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_250.globalsWritten._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_250.mutableGlobalsRead._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_250.localsWritten._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_250.localsRead._M_t);
    }
    if (bVar5) {
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_3b0.delegateTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_3b0.breakTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_3b0.globalsWritten._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_3b0.mutableGlobalsRead._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_3b0.localsWritten._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_3b0.localsRead._M_t);
    }
    if (((bVar7 != 0) && (pBVar9->op == EqInt32)) && (*(int *)(pEVar1 + 1) == 0x15)) {
      pBVar9->op = GeSInt32;
      return (Expression *)pBVar9;
    }
  }
  curr_00 = (Binary *)curr->left;
  local_e0.binder = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_e0.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
  local_f0 = local_38;
  if (((curr_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
       BinaryId) &&
     (local_38 = (undefined1  [8])curr_00->right,
     *(Id *)&(((element_type *)local_38)->type).id == ConstId)) {
    cy = (Const *)curr_00->left;
    Literal::Literal((Literal *)&local_b0.func,
                     (((element_type *)local_38)->values).super_SmallVector<wasm::Literal,_1UL>.
                     fixed._M_elems);
    bVar5 = Match::Internal::
            Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
            ::matches(&local_e0,
                      (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)
                      &local_b0.func);
    Literal::~Literal((Literal *)&local_b0.func);
    if (bVar5) {
      pEVar1 = curr->right;
      local_a0.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_a0.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
      local_b0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_48;
      if ((pEVar1->_id == BinaryId) && (pcVar2 = *(char **)(pEVar1 + 2), *pcVar2 == '\x0e')) {
        local_58 = pEVar1[1].type.id;
        local_48.id = (uintptr_t)pcVar2;
        Literal::Literal(&local_70,(Literal *)(pcVar2 + 0x10));
        bVar5 = Match::Internal::
                Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                ::matches(&local_a0,&local_70);
        Literal::~Literal(&local_70);
        if ((bVar5) &&
           (((curr_00->op == *(BinaryOp *)(pEVar1 + 1) &&
             ((cy->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id ==
              *(uintptr_t *)(local_58 + 8))) &&
            (bVar5 = Literal::operator==((((Literals *)((long)local_38 + 8))->
                                         super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                                         (Literal *)(local_48.id + 0x10)), bVar5)))) {
          bVar6 = inversesOr(local_50,curr_00);
          pCVar4 = cy;
          bVar5 = true;
          if (bVar6) {
            BVar8 = Abstract::getBinary((Type)(cy->
                                              super_SpecificExpression<(wasm::Expression::Id)14>).
                                              super_Expression.type.id,And);
            *(BinaryOp *)(pEVar1 + 1) = BVar8;
            (pEVar1->type).id =
                 (pCVar4->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.
                 id;
            pEVar1[1].type.id = (uintptr_t)pCVar4;
            *(uintptr_t *)(pEVar1 + 2) = local_58;
            curr_00->left = pEVar1;
            bVar5 = false;
            pBVar9 = curr_00;
          }
          goto LAB_009eaa32;
        }
      }
    }
  }
  bVar5 = true;
LAB_009eaa32:
  local_f0 = local_38;
  if (bVar5) {
    pBVar9 = (Binary *)curr->left;
    local_e0.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_e0.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
    if (((pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
         BinaryId) &&
       (local_38 = (undefined1  [8])pBVar9->right,
       *(Id *)&(((element_type *)local_38)->type).id == ConstId)) {
      pEVar1 = pBVar9->left;
      Literal::Literal((Literal *)&local_b0.func,
                       (((element_type *)local_38)->values).super_SmallVector<wasm::Literal,_1UL>.
                       fixed._M_elems);
      bVar5 = Match::Internal::
              Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
              ::matches(&local_e0,
                        (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_>
                         *)&local_b0.func);
      Literal::~Literal((Literal *)&local_b0.func);
      if (bVar5) {
        pEVar3 = curr->right;
        local_a0.binder =
             (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
        local_a0.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
        local_b0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_48;
        if ((pEVar3->_id == BinaryId) &&
           (local_48.id = *(uintptr_t *)(pEVar3 + 2), *(char *)local_48.id == '\x0e')) {
          cy = (Const *)pEVar3[1].type.id;
          Literal::Literal(&local_70,(Literal *)(local_48.id + 0x10));
          bVar5 = Match::Internal::
                  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                  ::matches(&local_a0,&local_70);
          Literal::~Literal(&local_70);
          if ((bVar5) &&
             ((((pBVar9->op == *(BinaryOp *)(pEVar3 + 1) &&
                ((pEVar1->type).id ==
                 (cy->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id))
               && (bVar5 = Literal::operator==((((Literals *)((long)local_38 + 8))->
                                               super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems
                                               ,(Literal *)(local_48.id + 0x10)), bVar5)) &&
              (bVar5 = preserveOr(local_50,pBVar9), bVar5)))) {
            BVar8 = Abstract::getBinary((Type)(pEVar1->type).id,Or);
            *(BinaryOp *)(pEVar3 + 1) = BVar8;
            (pEVar3->type).id = (pEVar1->type).id;
            pEVar3[1].type.id = (uintptr_t)pEVar1;
            *(Const **)(pEVar3 + 2) = cy;
            pBVar9->left = pEVar3;
            return (Expression *)pBVar9;
          }
        }
      }
    }
    pBVar9 = (Binary *)0x0;
  }
  return (Expression *)pBVar9;
}

Assistant:

Expression* combineOr(Binary* curr) {
    assert(curr->op == OrInt32);

    using namespace Abstract;
    using namespace Match;

    if (auto* left = curr->left->dynCast<Binary>()) {
      if (auto* right = curr->right->dynCast<Binary>()) {
        if (left->op != right->op &&
            ExpressionAnalyzer::equal(left->left, right->left) &&
            ExpressionAnalyzer::equal(left->right, right->right) &&
            !effects(left->left).hasSideEffects() &&
            !effects(left->right).hasSideEffects()) {
          switch (left->op) {
            //   (x > y) | (x == y)    ==>    x >= y
            case EqInt32: {
              if (right->op == GtSInt32) {
                left->op = GeSInt32;
                return left;
              }
              break;
            }
            default: {
            }
          }
        }
      }
    }
    {
      // Binary operations that inverses a bitwise OR to AND.
      // If F(x) = binary(x, c), and F(x) inverses OR,
      // that is,
      //
      //   F(x) | F(y) == F(x & y)
      //
      // Then also
      //
      //   binary(x, c) | binary(y, c)  =>  binary(x & y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          inversesOr(bx)) {
        by->op = getBinary(x->type, And);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    {
      // Binary operations that preserve a bitwise OR can be
      // reordered. If F(x) = binary(x, c), and F(x) preserves OR,
      // that is,
      //
      //   F(x) | F(y) == F(x | y)
      //
      // Then also
      //
      //   binary(x, c) | binary(y, c)  =>  binary(x | y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          preserveOr(bx)) {
        by->op = getBinary(x->type, Or);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    return nullptr;
  }